

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O3

int s2pred::EdgeCircumcenterSign(S2Point *x0,S2Point *x1,S2Point *a,S2Point *b,S2Point *c)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  undefined1 local_128 [16];
  longdouble local_118;
  longdouble local_108;
  Vector3_xf local_f8;
  Vector3_xf local_c8;
  Vector3_xf local_98;
  Vector3_xf local_68;
  
  local_128._10_6_ = (uint6)((ulong)x1->c_[1] >> 0x10) ^ 0x800000000000;
  local_128._0_8_ = -x1->c_[0];
  local_128._8_2_ = SUB82(x1->c_[1],0);
  local_118 = (longdouble)CONCAT28(local_118._8_2_,-x1->c_[2]);
  lVar5 = 0;
  do {
    dVar1 = *(double *)((long)x0->c_ + lVar5);
    dVar2 = *(double *)(local_128 + lVar5);
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
    bVar6 = lVar5 != 0x10;
    lVar5 = lVar5 + 8;
  } while (bVar6);
  if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) {
    S2LogMessage::S2LogMessage
              ((S2LogMessage *)&local_f8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2predicates.cc"
               ,0x426,kFatal,(ostream *)&std::cerr);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)CONCAT62(local_f8.c_[0].bn_.bn_._2_6_,local_f8.c_[0].bn_.bn_._0_2_),
               "Check failed: (x0) != (-x1) ",0x1c);
    abort();
  }
  iVar3 = Sign(a,b,c);
  iVar4 = TriageEdgeCircumcenterSign<double>(x0,x1,a,b,c,iVar3);
  if (iVar4 == 0) {
    lVar5 = 0;
    do {
      dVar1 = *(double *)((long)x0->c_ + lVar5);
      dVar2 = *(double *)((long)x1->c_ + lVar5);
      if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
      bVar6 = lVar5 != 0x10;
      lVar5 = lVar5 + 8;
    } while (bVar6);
    if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
      lVar5 = 0;
      do {
        dVar1 = *(double *)((long)a->c_ + lVar5);
        dVar2 = *(double *)((long)b->c_ + lVar5);
        if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
        bVar6 = lVar5 != 0x10;
        lVar5 = lVar5 + 8;
      } while (bVar6);
      if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
        lVar5 = 0;
        do {
          dVar1 = *(double *)((long)b->c_ + lVar5);
          dVar2 = *(double *)((long)c->c_ + lVar5);
          if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
          bVar6 = lVar5 != 0x10;
          lVar5 = lVar5 + 8;
        } while (bVar6);
        if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
          lVar5 = 0;
          do {
            dVar1 = *(double *)((long)c->c_ + lVar5);
            dVar2 = *(double *)((long)a->c_ + lVar5);
            if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) break;
            bVar6 = lVar5 != 0x10;
            lVar5 = lVar5 + 8;
          } while (bVar6);
          if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
            local_118 = (longdouble)x0->c_[1];
            local_108 = (longdouble)x0->c_[2];
            local_128._0_8_ = SUB108((longdouble)x0->c_[0],0);
            local_128._8_2_ = (undefined2)((unkuint10)(longdouble)x0->c_[0] >> 0x40);
            local_f8.c_[1]._0_10_ = (BADTYPE)x1->c_[1];
            local_f8.c_[2]._0_10_ = (BADTYPE)x1->c_[2];
            local_f8.c_[0]._0_8_ = SUB108((longdouble)x1->c_[0],0);
            local_f8.c_[0].bn_.bn_._0_2_ = (undefined2)((unkuint10)(longdouble)x1->c_[0] >> 0x40);
            local_68.c_[0]._0_10_ = (BADTYPE)a->c_[0];
            local_68.c_[1]._0_10_ = (BADTYPE)a->c_[1];
            local_68.c_[2]._0_10_ = (BADTYPE)a->c_[2];
            local_98.c_[0]._0_10_ = (BADTYPE)b->c_[0];
            local_98.c_[1]._0_10_ = (BADTYPE)b->c_[1];
            local_98.c_[2]._0_10_ = (BADTYPE)b->c_[2];
            local_c8.c_[0]._0_10_ = (BADTYPE)c->c_[0];
            local_c8.c_[1]._0_10_ = (BADTYPE)c->c_[1];
            local_c8.c_[2]._0_10_ = (BADTYPE)c->c_[2];
            iVar4 = TriageEdgeCircumcenterSign<long_double>
                              ((Vector3<long_double> *)local_128,(Vector3<long_double> *)&local_f8,
                               (Vector3<long_double> *)&local_68,(Vector3<long_double> *)&local_98,
                               (Vector3<long_double> *)&local_c8,iVar3);
            if (iVar4 != 0) {
              return iVar4;
            }
            util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
            GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                      (local_128,(BasicVector<Vector3,ExactFloat,3ul> *)x0);
            util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
            GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                      (&local_f8,(BasicVector<Vector3,ExactFloat,3ul> *)x1);
            util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
            GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                      (&local_68,(BasicVector<Vector3,ExactFloat,3ul> *)a);
            util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
            GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                      (&local_98,(BasicVector<Vector3,ExactFloat,3ul> *)b);
            util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::
            GenerateEach<Vector3<ExactFloat>,0ul,1ul,2ul,util::math::internal_vector::BasicVector<Vector3,ExactFloat,3ul>::Cast<double>(Vector3<double>const&)::_lambda(double_const&)_1_,double_const>
                      (&local_c8,(BasicVector<Vector3,ExactFloat,3ul> *)c);
            iVar3 = ExactEdgeCircumcenterSign
                              ((Vector3_xf *)local_128,&local_f8,&local_68,&local_98,&local_c8,iVar3
                              );
            Vector3<ExactFloat>::~Vector3(&local_c8);
            Vector3<ExactFloat>::~Vector3(&local_98);
            Vector3<ExactFloat>::~Vector3(&local_68);
            Vector3<ExactFloat>::~Vector3(&local_f8);
            Vector3<ExactFloat>::~Vector3((Vector3<ExactFloat> *)local_128);
            if (iVar3 != 0) {
              return iVar3;
            }
            iVar3 = SymbolicEdgeCircumcenterSign(x0,x1,a,b,c);
            return iVar3;
          }
        }
      }
    }
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int EdgeCircumcenterSign(const S2Point& x0, const S2Point& x1,
                         const S2Point& a, const S2Point& b,
                         const S2Point& c) {
  // Check that the edge does not consist of antipodal points.  (This catches
  // the most common case -- the full test is in ExactEdgeCircumcenterSign.)
  S2_DCHECK_NE(x0, -x1);

  int abc_sign = Sign(a, b, c);
  int sign = TriageEdgeCircumcenterSign(x0, x1, a, b, c, abc_sign);
  if (sign != 0) return sign;

  // Optimization for the cases that are going to return zero anyway, in order
  // to avoid falling back to exact arithmetic.
  if (x0 == x1 || a == b || b == c || c == a) return 0;

  sign = TriageEdgeCircumcenterSign(
      ToLD(x0), ToLD(x1), ToLD(a), ToLD(b), ToLD(c), abc_sign);
  if (sign != 0) return sign;
  sign = ExactEdgeCircumcenterSign(
      ToExact(x0), ToExact(x1), ToExact(a), ToExact(b), ToExact(c), abc_sign);
  if (sign != 0) return sign;

  // Unlike the other methods, SymbolicEdgeCircumcenterSign does not depend
  // on the sign of triangle ABC.
  return SymbolicEdgeCircumcenterSign(x0, x1, a, b, c);
}